

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
          *samples,bool logBucketPerformance)

{
  int iVar1;
  UploadSampleAnalyzeResult UVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  string *description;
  TestLog *pTVar6;
  const_reference pvVar7;
  offset_in_SampleType_to_deUint64 in_RCX;
  int numBytes;
  undefined1 auVar8 [12];
  pointer *local_19a0;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *local_17d0;
  allocator<char> local_1791;
  string local_1790;
  allocator<char> local_1769;
  string local_1768;
  allocator<char> local_1741;
  string local_1740;
  LogNumber<float> local_1720;
  allocator<char> local_16b1;
  string local_16b0;
  allocator<char> local_1689;
  string local_1688;
  allocator<char> local_1661;
  string local_1660;
  LogNumber<float> local_1640;
  allocator<char> local_15d1;
  string local_15d0;
  allocator<char> local_15a9;
  string local_15a8;
  allocator<char> local_1581;
  string local_1580;
  LogNumber<float> local_1560;
  allocator<char> local_14f1;
  string local_14f0;
  allocator<char> local_14c9;
  string local_14c8;
  allocator<char> local_14a1;
  string local_14a0;
  LogNumber<float> local_1480;
  allocator<char> local_1411;
  string local_1410;
  allocator<char> local_13e9;
  string local_13e8;
  allocator<char> local_13c1;
  string local_13c0;
  LogNumber<float> local_13a0;
  allocator<char> local_1331;
  string local_1330;
  allocator<char> local_1309;
  string local_1308;
  allocator<char> local_12e1;
  string local_12e0;
  LogNumber<float> local_12c0;
  allocator<char> local_1251;
  string local_1250;
  allocator<char> local_1229;
  string local_1228;
  allocator<char> local_1201;
  string local_1200;
  LogNumber<float> local_11e0;
  allocator<char> local_1171;
  string local_1170;
  allocator<char> local_1149;
  string local_1148;
  allocator<char> local_1121;
  string local_1120;
  LogNumber<float> local_1100;
  allocator<char> local_1091;
  string local_1090;
  allocator<char> local_1069;
  string local_1068;
  allocator<char> local_1041;
  string local_1040;
  LogNumber<float> local_1020;
  allocator<char> local_fb1;
  string local_fb0;
  allocator<char> local_f89;
  string local_f88;
  allocator<char> local_f61;
  string local_f60;
  LogNumber<float> local_f40;
  allocator<char> local_ed1;
  string local_ed0;
  allocator<char> local_ea9;
  string local_ea8;
  allocator<char> local_e81;
  string local_e80;
  LogNumber<float> local_e60;
  allocator<char> local_df1;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  allocator<char> local_da1;
  string local_da0;
  LogNumber<float> local_d80;
  float local_d18;
  float local_d14;
  float sampleTemporalStability;
  float sampleLinearity;
  float approximatedTransferTimeNoConstant;
  float approximatedTransferTime;
  int medianBufferSize;
  allocator<char> local_cd9;
  string local_cd8;
  ScopedLogSection local_cb8;
  ScopedLogSection section_2;
  string local_ca8;
  allocator<char> local_c81;
  string local_c80;
  allocator<char> local_c59;
  string local_c58;
  LogNumber<float> local_c38;
  allocator<char> local_bc9;
  string local_bc8;
  allocator<char> local_ba1;
  string local_ba0;
  allocator<char> local_b79;
  string local_b78;
  LogNumber<float> local_b58;
  allocator<char> local_ae9;
  string local_ae8;
  allocator<char> local_ac1;
  string local_ac0;
  allocator<char> local_a99;
  string local_a98;
  LogNumber<float> local_a78;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  LogNumber<float> local_998;
  allocator<char> local_929;
  string local_928;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  LogNumber<float> local_8b8;
  allocator<char> local_849;
  string local_848;
  allocator<char> local_821;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  LogNumber<float> local_7d8;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  LogNumber<float> local_6f8;
  allocator<char> local_689;
  string local_688;
  allocator<char> local_661;
  string local_660;
  allocator<char> local_639;
  string local_638;
  LogNumber<float> local_618;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  LogNumber<float> local_538;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  LogNumber<float> local_458;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  LogNumber<float> local_378;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  LogNumber<float> local_298;
  string local_230;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0;
  ScopedLogSection local_1a0;
  ScopedLogSection section_1;
  float local_190;
  StatsType stats;
  int bucketRangeMax;
  int bucketRangeMin;
  int bucketNdx;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  buckets [4];
  int local_f0;
  int local_ec;
  int maxBufferSize;
  int minBufferSize;
  int numBuckets;
  allocator<char> local_a9;
  string local_a8;
  ScopedLogSection local_88;
  ScopedLogSection section;
  float approximatedTransferRateNoConstant;
  float approximatedTransferRate;
  StatsType resultStats;
  LineParametersWithConfidence theilSenFitting;
  bool logBucketPerformance_local;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *samples_local;
  TestLog *log_local;
  UploadSampleAnalyzeResult result;
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>>
            ((LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,
             (_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              *)0x8,in_RCX);
  calculateSampleStatistics
            ((SingleCallStatistics *)&approximatedTransferRateNoConstant,
             (LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Samples",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numBuckets,"Samples",(allocator<char> *)((long)&minBufferSize + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_88,log,&local_a8,(string *)&numBuckets);
  std::__cxx11::string::~string((string *)&numBuckets);
  std::allocator<char>::~allocator((allocator<char> *)((long)&minBufferSize + 3));
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  logSampleList(log,(LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  tcu::ScopedLogSection::~ScopedLogSection(&local_88);
  if (logBucketPerformance) {
    maxBufferSize = 4;
    local_ec = 0;
    local_f0 = 0;
    local_17d0 = (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                  *)&bucketRangeMin;
    do {
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
      ::vector(local_17d0);
      local_17d0 = local_17d0 + 1;
    } while (local_17d0 !=
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              *)&buckets[3].
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bucketizeSamplesUniformly<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
              (samples,(vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                        *)&bucketRangeMin,4,&local_ec,&local_f0);
    for (bucketRangeMax = 0; bucketRangeMax < 4; bucketRangeMax = bucketRangeMax + 1) {
      bVar3 = std::
              vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              ::empty((vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                       *)(&bucketRangeMin + (long)bucketRangeMax * 6));
      if (!bVar3) {
        uVar4 = local_ec + (int)((float)bucketRangeMax * 0.25 * (float)(local_f0 - local_ec));
        uVar5 = local_ec + (int)((float)(bucketRangeMax + 1) * 0.25 * (float)(local_f0 - local_ec));
        calculateSampleStatistics
                  ((SingleCallStatistics *)((long)&section_1.m_log + 4),
                   (LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,
                   (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                    *)(&bucketRangeMin + (long)bucketRangeMax * 6));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"BufferSizeRange",&local_1c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1e8,"Transfer performance with buffer size in range [",&local_1e9);
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_210,(_anonymous_namespace_ *)(ulong)uVar4,numBytes);
        auVar8 = std::__cxx11::string::append((char *)&local_210);
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_230,(_anonymous_namespace_ *)(ulong)uVar5,auVar8._8_4_);
        std::__cxx11::string::append((char *)&local_230);
        std::__cxx11::string::append(auVar8._0_8_);
        description = (string *)std::__cxx11::string::append(local_1e8);
        tcu::ScopedLogSection::ScopedLogSection(&local_1a0,log,&local_1c0,description);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string(local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator(&local_1c1);
        logMapRangeStats<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                  (log,(StatsType *)((long)&section_1.m_log + 4));
        logUnmapStats<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                  (log,(StatsType *)((long)&section_1.m_log + 4));
        logWriteStats<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                  (log,(StatsType *)((long)&section_1.m_log + 4));
        logFlushStats<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                  (log,(StatsType *)((long)&section_1.m_log + 4));
        logAllocStats<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                  (log,(StatsType *)((long)&section_1.m_log + 4));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"Min",&local_2b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e0,"Total: Min time",&local_2e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"us",&local_309);
        tcu::LogNumber<float>::LogNumber
                  (&local_298,&local_2b8,&local_2e0,&local_308,QP_KEY_TAG_TIME,section_1.m_log._4_4_
                  );
        pTVar6 = tcu::TestLog::operator<<(log,&local_298);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"Max",&local_399);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c0,"Total: Max time",&local_3c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"us",&local_3e9);
        tcu::LogNumber<float>::LogNumber
                  (&local_378,&local_398,&local_3c0,&local_3e8,QP_KEY_TAG_TIME,local_190);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_378);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"Min90",&local_479);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a0,"Total: 90%-Min time",&local_4a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"us",&local_4c9);
        tcu::LogNumber<float>::LogNumber
                  (&local_458,&local_478,&local_4a0,&local_4c8,QP_KEY_TAG_TIME,stats.result.maxTime)
        ;
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_458);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"Max90",&local_559);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_580,"Total: 90%-Max time",&local_581);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"us",&local_5a9);
        tcu::LogNumber<float>::LogNumber
                  (&local_538,&local_558,&local_580,&local_5a8,QP_KEY_TAG_TIME,
                   stats.result.medianTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_538);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"Median",&local_639)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_660,"Total: Median time",&local_661);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"us",&local_689);
        tcu::LogNumber<float>::LogNumber
                  (&local_618,&local_638,&local_660,&local_688,QP_KEY_TAG_TIME,stats.result.minTime)
        ;
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_618);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_718,"MedianTransfer",&local_719);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_740,"Median transfer rate",&local_741);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"MB / s",&local_769)
        ;
        tcu::LogNumber<float>::LogNumber
                  (&local_6f8,&local_718,&local_740,&local_768,QP_KEY_TAG_PERFORMANCE,
                   stats.result.min2DecileTime * 0.0009765625 * 0.0009765625);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_6f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7f8,"MaxDiff",&local_7f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_820,"Max difference to approximated",&local_821);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_848,"us",&local_849);
        tcu::LogNumber<float>::LogNumber
                  (&local_7d8,&local_7f8,&local_820,&local_848,QP_KEY_TAG_TIME,
                   stats.result.max9DecileTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_7d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8d8,"Max90Diff",&local_8d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_900,"90%-Max difference to approximated",&local_901);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"us",&local_929);
        tcu::LogNumber<float>::LogNumber
                  (&local_8b8,&local_8d8,&local_900,&local_928,QP_KEY_TAG_TIME,stats.medianRate);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_8b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9b8,"MedianDiff",&local_9b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9e0,"Median difference to approximated",&local_9e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"us",&local_a09);
        tcu::LogNumber<float>::LogNumber
                  (&local_998,&local_9b8,&local_9e0,&local_a08,QP_KEY_TAG_TIME,stats.maxDiffTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_998);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a98,"MaxRelDiff",&local_a99);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ac0,"Max relative difference to approximated",&local_ac1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae8,"%",&local_ae9);
        tcu::LogNumber<float>::LogNumber
                  (&local_a78,&local_a98,&local_ac0,&local_ae8,QP_KEY_TAG_NONE,
                   stats.maxDiff9DecileTime * 100.0);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_a78);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b78,"Max90RelDiff",&local_b79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ba0,"90%-Max relative difference to approximated",&local_ba1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc8,"%",&local_bc9);
        tcu::LogNumber<float>::LogNumber
                  (&local_b58,&local_b78,&local_ba0,&local_bc8,QP_KEY_TAG_NONE,
                   stats.medianDiffTime * 100.0);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_b58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c58,"MedianRelDiff",&local_c59);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c80,"Median relative difference to approximated",&local_c81);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ca8,"%",(allocator<char> *)((long)&section_2.m_log + 7));
        tcu::LogNumber<float>::LogNumber
                  (&local_c38,&local_c58,&local_c80,&local_ca8,QP_KEY_TAG_NONE,
                   stats.maxRelDiffTime * 100.0);
        tcu::TestLog::operator<<(pTVar6,&local_c38);
        tcu::LogNumber<float>::~LogNumber(&local_c38);
        std::__cxx11::string::~string((string *)&local_ca8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
        std::__cxx11::string::~string((string *)&local_c80);
        std::allocator<char>::~allocator(&local_c81);
        std::__cxx11::string::~string((string *)&local_c58);
        std::allocator<char>::~allocator(&local_c59);
        tcu::LogNumber<float>::~LogNumber(&local_b58);
        std::__cxx11::string::~string((string *)&local_bc8);
        std::allocator<char>::~allocator(&local_bc9);
        std::__cxx11::string::~string((string *)&local_ba0);
        std::allocator<char>::~allocator(&local_ba1);
        std::__cxx11::string::~string((string *)&local_b78);
        std::allocator<char>::~allocator(&local_b79);
        tcu::LogNumber<float>::~LogNumber(&local_a78);
        std::__cxx11::string::~string((string *)&local_ae8);
        std::allocator<char>::~allocator(&local_ae9);
        std::__cxx11::string::~string((string *)&local_ac0);
        std::allocator<char>::~allocator(&local_ac1);
        std::__cxx11::string::~string((string *)&local_a98);
        std::allocator<char>::~allocator(&local_a99);
        tcu::LogNumber<float>::~LogNumber(&local_998);
        std::__cxx11::string::~string((string *)&local_a08);
        std::allocator<char>::~allocator(&local_a09);
        std::__cxx11::string::~string((string *)&local_9e0);
        std::allocator<char>::~allocator(&local_9e1);
        std::__cxx11::string::~string((string *)&local_9b8);
        std::allocator<char>::~allocator(&local_9b9);
        tcu::LogNumber<float>::~LogNumber(&local_8b8);
        std::__cxx11::string::~string((string *)&local_928);
        std::allocator<char>::~allocator(&local_929);
        std::__cxx11::string::~string((string *)&local_900);
        std::allocator<char>::~allocator(&local_901);
        std::__cxx11::string::~string((string *)&local_8d8);
        std::allocator<char>::~allocator(&local_8d9);
        tcu::LogNumber<float>::~LogNumber(&local_7d8);
        std::__cxx11::string::~string((string *)&local_848);
        std::allocator<char>::~allocator(&local_849);
        std::__cxx11::string::~string((string *)&local_820);
        std::allocator<char>::~allocator(&local_821);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::allocator<char>::~allocator(&local_7f9);
        tcu::LogNumber<float>::~LogNumber(&local_6f8);
        std::__cxx11::string::~string((string *)&local_768);
        std::allocator<char>::~allocator(&local_769);
        std::__cxx11::string::~string((string *)&local_740);
        std::allocator<char>::~allocator(&local_741);
        std::__cxx11::string::~string((string *)&local_718);
        std::allocator<char>::~allocator(&local_719);
        tcu::LogNumber<float>::~LogNumber(&local_618);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator(&local_689);
        std::__cxx11::string::~string((string *)&local_660);
        std::allocator<char>::~allocator(&local_661);
        std::__cxx11::string::~string((string *)&local_638);
        std::allocator<char>::~allocator(&local_639);
        tcu::LogNumber<float>::~LogNumber(&local_538);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::allocator<char>::~allocator(&local_5a9);
        std::__cxx11::string::~string((string *)&local_580);
        std::allocator<char>::~allocator(&local_581);
        std::__cxx11::string::~string((string *)&local_558);
        std::allocator<char>::~allocator(&local_559);
        tcu::LogNumber<float>::~LogNumber(&local_458);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::allocator<char>::~allocator(&local_4c9);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::allocator<char>::~allocator(&local_4a1);
        std::__cxx11::string::~string((string *)&local_478);
        std::allocator<char>::~allocator(&local_479);
        tcu::LogNumber<float>::~LogNumber(&local_378);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::allocator<char>::~allocator(&local_3e9);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::allocator<char>::~allocator(&local_3c1);
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator(&local_399);
        tcu::LogNumber<float>::~LogNumber(&local_298);
        std::__cxx11::string::~string((string *)&local_308);
        std::allocator<char>::~allocator(&local_309);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator(&local_2e1);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::allocator<char>::~allocator(&local_2b9);
        tcu::ScopedLogSection::~ScopedLogSection(&local_1a0);
      }
    }
    local_19a0 = &buckets[3].
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_19a0 = local_19a0 + -3;
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
      ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                 *)local_19a0);
    } while (local_19a0 != (pointer *)&bucketRangeMin);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cd8,"Results",&local_cd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&medianBufferSize,"Results",
             (allocator<char> *)((long)&approximatedTransferTime + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_cb8,log,&local_cd8,(string *)&medianBufferSize);
  std::__cxx11::string::~string((string *)&medianBufferSize);
  std::allocator<char>::~allocator((allocator<char> *)((long)&approximatedTransferTime + 3));
  std::__cxx11::string::~string((string *)&local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  pvVar7 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           ::front(samples);
  iVar1 = pvVar7->bufferSize;
  pvVar7 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           ::back(samples);
  approximatedTransferTimeNoConstant = (float)((iVar1 + pvVar7->bufferSize) / 2);
  sampleLinearity =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedTransferTimeNoConstant +
        resultStats.max9DecileRelDiffTime) / 1000.0) / 1000.0;
  sampleTemporalStability =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedTransferTimeNoConstant) /
       1000.0) / 1000.0;
  local_d14 = calculateSampleFitLinearity<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        (samples);
  local_d18 = calculateSampleTemporalStability<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        (samples);
  section.m_log._0_4_ = (float)(int)approximatedTransferTimeNoConstant / sampleTemporalStability;
  section.m_log._4_4_ = (float)(int)approximatedTransferTimeNoConstant / sampleLinearity;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_da0,"ResultLinearity",&local_da1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dc8,"Sample linearity",&local_dc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_df0,"%",&local_df1);
  tcu::LogNumber<float>::LogNumber
            (&local_d80,&local_da0,&local_dc8,&local_df0,QP_KEY_TAG_QUALITY,local_d14 * 100.0);
  pTVar6 = tcu::TestLog::operator<<(log,&local_d80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e80,"SampleTemporalStability",&local_e81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ea8,"Sample temporal stability",&local_ea9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ed0,"%",&local_ed1);
  tcu::LogNumber<float>::LogNumber
            (&local_e60,&local_e80,&local_ea8,&local_ed0,QP_KEY_TAG_QUALITY,local_d18 * 100.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_e60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f60,"ApproximatedConstantCost",&local_f61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f88,"Approximated contant cost",&local_f89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fb0,"us",&local_fb1);
  tcu::LogNumber<float>::LogNumber
            (&local_f40,&local_f60,&local_f88,&local_fb0,QP_KEY_TAG_TIME,
             resultStats.max9DecileRelDiffTime);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_f40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1040,"ApproximatedConstantCostConfidence60Lower",&local_1041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1068,"Approximated contant cost 60% confidence lower limit",
             &local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1090,"us",&local_1091);
  tcu::LogNumber<float>::LogNumber
            (&local_1020,&local_1040,&local_1068,&local_1090,QP_KEY_TAG_TIME,theilSenFitting.offset)
  ;
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1020);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1120,"ApproximatedConstantCostConfidence60Upper",&local_1121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1148,"Approximated contant cost 60% confidence upper limit",
             &local_1149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1170,"us",&local_1171);
  tcu::LogNumber<float>::LogNumber
            (&local_1100,&local_1120,&local_1148,&local_1170,QP_KEY_TAG_TIME,
             resultStats.medianRelDiffTime);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1200,"ApproximatedLinearCost",&local_1201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1228,"Approximated linear cost",&local_1229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1250,"us / MB",&local_1251);
  tcu::LogNumber<float>::LogNumber
            (&local_11e0,&local_1200,&local_1228,&local_1250,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper * 1024.0 * 1024.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_11e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e0,"ApproximatedLinearCostConfidence60Lower",&local_12e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1308,"Approximated linear cost 60% confidence lower limit",&local_1309
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1330,"us / MB",&local_1331);
  tcu::LogNumber<float>::LogNumber
            (&local_12c0,&local_12e0,&local_1308,&local_1330,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_12c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13c0,"ApproximatedLinearCostConfidence60Upper",&local_13c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13e8,"Approximated linear cost 60% confidence upper limit",&local_13e9
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1410,"us / MB",&local_1411);
  tcu::LogNumber<float>::LogNumber
            (&local_13a0,&local_13c0,&local_13e8,&local_1410,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower * 1024.0 * 1024.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_13a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14a0,"ApproximatedTransferRate",&local_14a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"Approximated transfer rate",&local_14c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14f0,"MB / s",&local_14f1);
  tcu::LogNumber<float>::LogNumber
            (&local_1480,&local_14a0,&local_14c8,&local_14f0,QP_KEY_TAG_PERFORMANCE,
             section.m_log._4_4_ * 0.0009765625 * 0.0009765625);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1580,"ApproximatedTransferRateNoConstant",&local_1581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15a8,"Approximated transfer rate without constant cost",&local_15a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_15d0,"MB / s",&local_15d1);
  tcu::LogNumber<float>::LogNumber
            (&local_1560,&local_1580,&local_15a8,&local_15d0,QP_KEY_TAG_PERFORMANCE,
             section.m_log._0_4_ * 0.0009765625 * 0.0009765625);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1660,"SampleMedianTime",&local_1661);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1688,"Median sample time",&local_1689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_16b0,"us",&local_16b1);
  tcu::LogNumber<float>::LogNumber
            (&local_1640,&local_1660,&local_1688,&local_16b0,QP_KEY_TAG_TIME,
             resultStats.result.minTime);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1740,"SampleMedianTransfer",&local_1741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1768,"Median transfer rate",&local_1769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1790,"MB / s",&local_1791);
  tcu::LogNumber<float>::LogNumber
            (&local_1720,&local_1740,&local_1768,&local_1790,QP_KEY_TAG_PERFORMANCE,
             resultStats.result.min2DecileTime * 0.0009765625 * 0.0009765625);
  tcu::TestLog::operator<<(pTVar6,&local_1720);
  tcu::LogNumber<float>::~LogNumber(&local_1720);
  std::__cxx11::string::~string((string *)&local_1790);
  std::allocator<char>::~allocator(&local_1791);
  std::__cxx11::string::~string((string *)&local_1768);
  std::allocator<char>::~allocator(&local_1769);
  std::__cxx11::string::~string((string *)&local_1740);
  std::allocator<char>::~allocator(&local_1741);
  tcu::LogNumber<float>::~LogNumber(&local_1640);
  std::__cxx11::string::~string((string *)&local_16b0);
  std::allocator<char>::~allocator(&local_16b1);
  std::__cxx11::string::~string((string *)&local_1688);
  std::allocator<char>::~allocator(&local_1689);
  std::__cxx11::string::~string((string *)&local_1660);
  std::allocator<char>::~allocator(&local_1661);
  tcu::LogNumber<float>::~LogNumber(&local_1560);
  std::__cxx11::string::~string((string *)&local_15d0);
  std::allocator<char>::~allocator(&local_15d1);
  std::__cxx11::string::~string((string *)&local_15a8);
  std::allocator<char>::~allocator(&local_15a9);
  std::__cxx11::string::~string((string *)&local_1580);
  std::allocator<char>::~allocator(&local_1581);
  tcu::LogNumber<float>::~LogNumber(&local_1480);
  std::__cxx11::string::~string((string *)&local_14f0);
  std::allocator<char>::~allocator(&local_14f1);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::allocator<char>::~allocator(&local_14c9);
  std::__cxx11::string::~string((string *)&local_14a0);
  std::allocator<char>::~allocator(&local_14a1);
  tcu::LogNumber<float>::~LogNumber(&local_13a0);
  std::__cxx11::string::~string((string *)&local_1410);
  std::allocator<char>::~allocator(&local_1411);
  std::__cxx11::string::~string((string *)&local_13e8);
  std::allocator<char>::~allocator(&local_13e9);
  std::__cxx11::string::~string((string *)&local_13c0);
  std::allocator<char>::~allocator(&local_13c1);
  tcu::LogNumber<float>::~LogNumber(&local_12c0);
  std::__cxx11::string::~string((string *)&local_1330);
  std::allocator<char>::~allocator(&local_1331);
  std::__cxx11::string::~string((string *)&local_1308);
  std::allocator<char>::~allocator(&local_1309);
  std::__cxx11::string::~string((string *)&local_12e0);
  std::allocator<char>::~allocator(&local_12e1);
  tcu::LogNumber<float>::~LogNumber(&local_11e0);
  std::__cxx11::string::~string((string *)&local_1250);
  std::allocator<char>::~allocator(&local_1251);
  std::__cxx11::string::~string((string *)&local_1228);
  std::allocator<char>::~allocator(&local_1229);
  std::__cxx11::string::~string((string *)&local_1200);
  std::allocator<char>::~allocator(&local_1201);
  tcu::LogNumber<float>::~LogNumber(&local_1100);
  std::__cxx11::string::~string((string *)&local_1170);
  std::allocator<char>::~allocator(&local_1171);
  std::__cxx11::string::~string((string *)&local_1148);
  std::allocator<char>::~allocator(&local_1149);
  std::__cxx11::string::~string((string *)&local_1120);
  std::allocator<char>::~allocator(&local_1121);
  tcu::LogNumber<float>::~LogNumber(&local_1020);
  std::__cxx11::string::~string((string *)&local_1090);
  std::allocator<char>::~allocator(&local_1091);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator(&local_1069);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator(&local_1041);
  tcu::LogNumber<float>::~LogNumber(&local_f40);
  std::__cxx11::string::~string((string *)&local_fb0);
  std::allocator<char>::~allocator(&local_fb1);
  std::__cxx11::string::~string((string *)&local_f88);
  std::allocator<char>::~allocator(&local_f89);
  std::__cxx11::string::~string((string *)&local_f60);
  std::allocator<char>::~allocator(&local_f61);
  tcu::LogNumber<float>::~LogNumber(&local_e60);
  std::__cxx11::string::~string((string *)&local_ed0);
  std::allocator<char>::~allocator(&local_ed1);
  std::__cxx11::string::~string((string *)&local_ea8);
  std::allocator<char>::~allocator(&local_ea9);
  std::__cxx11::string::~string((string *)&local_e80);
  std::allocator<char>::~allocator(&local_e81);
  tcu::LogNumber<float>::~LogNumber(&local_d80);
  std::__cxx11::string::~string((string *)&local_df0);
  std::allocator<char>::~allocator(&local_df1);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::allocator<char>::~allocator(&local_dc9);
  std::__cxx11::string::~string((string *)&local_da0);
  std::allocator<char>::~allocator(&local_da1);
  tcu::ScopedLogSection::~ScopedLogSection(&local_cb8);
  UVar2.transferRateAtRange = section.m_log._4_4_;
  UVar2.transferRateMedian = resultStats.result.min2DecileTime;
  UVar2.transferRateAtInfinity = section.m_log._0_4_;
  return UVar2;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}